

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_dxil_std450_unary_instruction
               (GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ValueKind VVar4;
  Id IVar5;
  BinaryOps BVar6;
  uint uVar7;
  uint uVar8;
  Id type_id;
  Builder *pBVar9;
  Value *pVVar10;
  Instruction *pIVar11;
  Operation *this;
  BinaryOperator *pBVar12;
  Value *pVVar13;
  Constant *this_00;
  Value *value;
  Value *pVVar14;
  Value *value_00;
  APFloat *this_01;
  Operation *this_02;
  Type *pTVar15;
  LoggingCallback p_Var16;
  void *pvVar17;
  pair<const_LLVMBC::Value_*,_double> pVar18;
  pair<const_LLVMBC::Value_*,_double> pVar19;
  double local_1060;
  String local_1038 [128];
  
  pBVar9 = Converter::Impl::builder(impl);
  if (opcode - GLSLstd450Exp2 < 2) {
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
               local_1038,"dx.precise","");
    bVar2 = LLVMBC::Instruction::hasMetadata(&instruction->super_Instruction,local_1038);
    bVar3 = (impl->options).force_precise;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      free_in_thread(local_1038[0]._M_dataplus._M_p);
    }
    if (!bVar2 && (bVar3 & 1U) == 0) {
      if (opcode == GLSLstd450Exp2) {
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        bVar3 = value_is_dx_op_instrinsic(pVVar10,Log);
        if (!bVar3) goto LAB_00164d21;
      }
      else {
LAB_00164d21:
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        bVar3 = value_is_dx_op_instrinsic(pVVar10,Exp);
        if (!bVar3) goto LAB_00164d94;
      }
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      pIVar11 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar10);
      VVar4 = LLVMBC::Value::get_value_kind((Value *)pIVar11);
      if (VVar4 == Call) {
        pVVar10 = LLVMBC::Instruction::getOperand(pIVar11,1);
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar5);
        return true;
      }
      p_Var16 = get_thread_log_callback();
      if (p_Var16 == (LoggingCallback)0x0) {
        emit_dxil_std450_unary_instruction();
        std::terminate();
      }
      goto LAB_0016517a;
    }
  }
LAB_00164d94:
  if (impl->glsl_std450_ext == 0) {
    IVar5 = spv::Builder::import(pBVar9,"GLSL.std.450");
    impl->glsl_std450_ext = IVar5;
  }
  this = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction);
  Operation::add_id(this,impl->glsl_std450_ext);
  Operation::add_literal(this,opcode);
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar5 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  if ((opcode == GLSLstd450Sqrt) &&
     (pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1),
     pVVar10 != (Value *)0x0)) {
    pBVar12 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(pVVar10);
    VVar4 = LLVMBC::Value::get_value_kind((Value *)pBVar12);
    if ((VVar4 == BinaryOperator) &&
       (((BVar6 = LLVMBC::BinaryOperator::getOpcode(pBVar12), BVar6 == FSub &&
         (bVar3 = LLVMBC::BinaryOperator::isFast(pBVar12), bVar3)) &&
        (pVVar13 = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,0),
        pVVar13 != (Value *)0x0)))) {
      this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar13);
      VVar4 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if (VVar4 == ConstantFP) {
        pVVar13 = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,1);
        pVar18 = split_constant_multipliers(pVVar13);
        local_1060 = pVar18.second;
        if (pVar18.first == (Value *)0x0) {
LAB_0016504d:
          this_01 = LLVMBC::Constant::getValueAPF(this_00);
          dVar1 = LLVMBC::APFloat::convertToDouble(this_01);
          if ((local_1060 != 0.0) || (NAN(local_1060))) {
            if ((dVar1 == local_1060) && (!NAN(dVar1) && !NAN(local_1060))) {
              pTVar15 = LLVMBC::Value::getType(pVVar10);
              type_id = Converter::Impl::get_type_id(impl,pTVar15,0);
              this_02 = Converter::Impl::allocate(impl,OpExtInst,type_id);
              Operation::add_id(this_02,impl->glsl_std450_ext);
              Operation::add_literal(this_02,0x28);
              Operation::add_id(this_02,IVar5);
              pBVar9 = Converter::Impl::builder(impl);
              IVar5 = spv::Builder::makeNullConstant(pBVar9,this_02->type_id);
              Operation::add_id(this_02,IVar5);
              Converter::Impl::add(impl,this_02,false);
              IVar5 = this_02->id;
            }
          }
        }
        else {
          pBVar12 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(pVar18.first);
          VVar4 = LLVMBC::Value::get_value_kind((Value *)pBVar12);
          if ((VVar4 == BinaryOperator) &&
             (BVar6 = LLVMBC::BinaryOperator::getOpcode(pBVar12), BVar6 == FMul)) {
            pVVar13 = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,0);
            value = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,1);
            pVar18 = split_constant_multipliers(pVVar13);
            pVVar14 = pVar18.first;
            pVar19 = split_constant_multipliers(value);
            value_00 = pVar19.first;
            if ((0.0 <= pVar18.second) && (0.0 <= pVar19.second)) {
              if (pVVar14 != (Value *)0x0) {
                pVVar13 = pVVar14;
              }
              bVar3 = is_canonically_normalizing_value(pVVar14);
              if (value_00 == (Value *)0x0) {
                bVar2 = is_canonically_normalizing_value((Value *)0x0);
              }
              else {
                bVar2 = is_canonically_normalizing_value(value_00);
                value = value_00;
              }
              pVVar14 = pVVar13;
              if (bVar3) {
                pVVar14 = value;
              }
              if ((bVar2 | bVar3) == 1) {
                if (bVar3) {
                  value = pVVar13;
                }
                pIVar11 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
                VVar4 = LLVMBC::Value::get_value_kind((Value *)pIVar11);
                if (VVar4 == Call) {
                  pVVar13 = LLVMBC::Instruction::getOperand(pIVar11,1);
                  pIVar11 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar13);
                  VVar4 = LLVMBC::Value::get_value_kind((Value *)pIVar11);
                  if (VVar4 == Call) {
                    uVar7 = LLVMBC::Instruction::getNumOperands(pIVar11);
                    if (1 < uVar7) {
                      uVar7 = 1;
                      do {
                        pVVar13 = LLVMBC::Instruction::getOperand(pIVar11,uVar7);
                        if (pVVar13 == pVVar14) {
                          local_1060 = local_1060 * pVar18.second * pVar19.second;
                          goto LAB_0016504d;
                        }
                        uVar7 = uVar7 + 1;
                        uVar8 = LLVMBC::Instruction::getNumOperands(pIVar11);
                      } while (uVar7 < uVar8);
                    }
                    goto LAB_001650fa;
                  }
                  p_Var16 = get_thread_log_callback();
                  if (p_Var16 == (LoggingCallback)0x0) {
                    emit_dxil_std450_unary_instruction();
                    std::terminate();
                  }
                }
                else {
                  p_Var16 = get_thread_log_callback();
                  if (p_Var16 == (LoggingCallback)0x0) {
                    emit_dxil_std450_unary_instruction();
                    std::terminate();
                  }
                }
LAB_0016517a:
                local_1038[0].field_2._M_allocated_capacity._0_5_ = 0x6163206e69;
                local_1038[0].field_2._5_1_ = 's';
                local_1038[0].field_2._6_1_ = 't';
                local_1038[0].field_2._7_1_ = '<';
                local_1038[0].field_2._8_1_ = 'T';
                local_1038[0].field_2._9_1_ = '>';
                local_1038[0].field_2._10_1_ = '.';
                local_1038[0].field_2._11_1_ = '\n';
                local_1038[0].field_2._12_1_ = '\0';
                local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
                local_1038[0]._M_string_length._0_5_ = 0x2065707974;
                local_1038[0]._M_string_length._5_3_ = 0x204449;
                pvVar17 = get_thread_log_callback_userdata();
                (*p_Var16)(pvVar17,Error,(char *)local_1038);
                std::terminate();
              }
            }
          }
        }
      }
    }
  }
LAB_001650fa:
  Operation::add_id(this,IVar5);
  Converter::Impl::add(impl,this,false);
  pTVar15 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar15,this->id,false);
  return true;
}

Assistant:

bool emit_dxil_std450_unary_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// Games rely on this peephole, since DXC doesn't do it for us.
	if (opcode == GLSLstd450Exp2 || opcode == GLSLstd450Log2)
	{
		bool precise = instruction->hasMetadata("dx.precise") || impl.options.force_precise;
		if (!precise)
		{
			if ((opcode == GLSLstd450Exp2 && value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Log)) ||
			    (value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Exp)))
			{
				auto *base_value = llvm::cast<llvm::CallInst>(instruction->getOperand(1))->getOperand(1);
				impl.rewrite_value(instruction, impl.get_id_for_value(base_value));
				return true;
			}
		}
	}

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);

	spv::Id id = impl.get_id_for_value(instruction->getOperand(1));
	if (opcode == GLSLstd450Sqrt)
		id = build_clamped_non_negative_sqrt(impl, id, instruction->getOperand(1));

	op->add_id(id);

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}